

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.c
# Opt level: O0

long * permute_dist(distribution *d,long stream)

{
  distribution *pdVar1;
  long *plVar2;
  undefined8 in_RSI;
  distribution *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int c;
  long *local_8;
  
  c = (int)((ulong)in_RSI >> 0x20);
  if (in_RDI == (distribution *)0x0) {
    if (permute_dist::dist == (distribution *)0x0) {
      fprintf(_stderr,"%s","Bad call to permute_dist");
      abort();
    }
    local_8 = permute((long *)0x0,c,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  else {
    pdVar1 = in_RDI;
    if (in_RDI->permute == (long *)0x0) {
      plVar2 = (long *)malloc((long)in_RDI->count << 3);
      in_RDI->permute = plVar2;
      if (in_RDI->permute == (long *)0x0) {
        fprintf(_stderr,"Malloc failed at %s:%d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/permute.c"
                ,0x6b);
        exit(1);
      }
      for (in_stack_ffffffffffffffe4 = 0; pdVar1 = in_RDI, in_stack_ffffffffffffffe4 < in_RDI->count
          ; in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1) {
        in_RDI->permute[in_stack_ffffffffffffffe4] = (long)in_stack_ffffffffffffffe4;
      }
    }
    permute_dist::dist = pdVar1;
    local_8 = permute((long *)permute_dist::dist,c,
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  return local_8;
}

Assistant:

long *
permute_dist(distribution *d, long stream)
	{
	static distribution *dist = NULL;
	int i;
	
	if (d != NULL)
		{
		if (d->permute == (long *)NULL)
			{
			d->permute = (long *)malloc(sizeof(long) * DIST_SIZE(d));
			MALLOC_CHECK(d->permute);
			for (i=0; i < DIST_SIZE(d); i++) 
				*(d->permute + i) = i;
			}
		dist = d;
		return(permute(dist->permute, DIST_SIZE(dist), stream));
		}
	
	
	if (dist != NULL)
		return(permute(NULL, DIST_SIZE(dist), stream));
	else
		INTERNAL_ERROR("Bad call to permute_dist");	
	}